

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polar_extent.cpp
# Opt level: O0

void __thiscall ear::PolarExtent::~PolarExtent(PolarExtent *this)

{
  PolarExtent *this_local;
  
  xsimd::aligned_free((this->ctx).xs);
  xsimd::aligned_free((this->ctx).ys);
  xsimd::aligned_free((this->ctx).zs);
  xsimd::aligned_free((this->ctx).panning_results);
  xsimd::aligned_free((this->ctx).summed_panning_results);
  xsimd::aligned_free((this->ctx).results);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix(&this->pvsMax);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix(&this->pvsMin);
  std::shared_ptr<ear::PointSourcePanner>::~shared_ptr(&this->psp);
  std::unique_ptr<ear::PolarExtentCore,_std::default_delete<ear::PolarExtentCore>_>::~unique_ptr
            (&this->core_impl);
  return;
}

Assistant:

PolarExtent::~PolarExtent() {
    xsimd::aligned_free(ctx.xs);
    xsimd::aligned_free(ctx.ys);
    xsimd::aligned_free(ctx.zs);
    xsimd::aligned_free(ctx.panning_results);
    xsimd::aligned_free(ctx.summed_panning_results);
    xsimd::aligned_free(ctx.results);
  }